

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sorter.h
# Opt level: O2

void soplex::SPxShellsort<soplex::Nonzero<double>,soplex::SPxMainSM<double>::ElementCompare>
               (Nonzero<double> *keys,int end,ElementCompare *compare,int start)

{
  int iVar1;
  double dVar2;
  int iVar3;
  int iVar4;
  int iVar5;
  uint uVar6;
  long lVar7;
  int iVar8;
  
  uVar6 = 2;
  do {
    if ((int)uVar6 < 0) {
      return;
    }
    iVar3 = SPxShellsort<soplex::Nonzero<double>,_soplex::SPxMainSM<double>::ElementCompare>::incs
            [uVar6];
    iVar5 = start;
    for (lVar7 = (long)(iVar3 + start); lVar7 <= end; lVar7 = lVar7 + 1) {
      dVar2 = keys[lVar7].val;
      iVar4 = keys[lVar7].idx;
      for (iVar8 = iVar5; iVar1 = iVar3 + iVar8, iVar3 + start <= iVar1; iVar8 = iVar8 - iVar3) {
        if ((ABS(dVar2 - keys[iVar8].val) <= compare->epsiloncompare) || (keys[iVar8].val <= dVar2))
        break;
        keys[iVar1].idx = keys[iVar8].idx;
        keys[iVar1].val = keys[iVar8].val;
      }
      keys[iVar1].val = dVar2;
      keys[iVar1].idx = iVar4;
      iVar5 = iVar5 + 1;
    }
    uVar6 = uVar6 - 1;
  } while( true );
}

Assistant:

void SPxShellsort(T* keys, int end, COMPARATOR& compare, int start = 0)
{
   static const int incs[3] = {1, 5, 19}; /* sequence of increments */
   int k;

   assert(start <= end);

   for(k = 2; k >= 0; --k)
   {
      int h = incs[k];
      int first = h + start;
      int i;

      for(i = first; i <= end; ++i)
      {
         int j;
         T tempkey = keys[i];

         j = i;

         while(j >= first && compare(tempkey, keys[j - h]) < 0)
         {
            keys[j] = keys[j - h];
            j -= h;
         }

         keys[j] = tempkey;
      }
   }
}